

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

int nghttp2_bufs_addb_hold(nghttp2_bufs *bufs,uint8_t b)

{
  int iVar1;
  uint8_t *puVar2;
  
  puVar2 = (bufs->cur->buf).last;
  if ((bufs->cur->buf).end == puVar2) {
    iVar1 = bufs_alloc_chain(bufs);
    if (iVar1 != 0) {
      return iVar1;
    }
    puVar2 = (bufs->cur->buf).last;
  }
  *puVar2 = b;
  return 0;
}

Assistant:

int nghttp2_bufs_addb_hold(nghttp2_bufs *bufs, uint8_t b) {
  int rv;

  rv = bufs_ensure_addb(bufs);
  if (rv != 0) {
    return rv;
  }

#ifdef __clang_analyzer__
  assert(bufs->cur->buf.last);
#endif

  *bufs->cur->buf.last = b;

  return 0;
}